

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O2

coda_product_type * coda_product_type_new(char *name)

{
  coda_product_type *product_type;
  char *pcVar1;
  hashtable *phVar2;
  undefined8 uVar3;
  
  product_type = (coda_product_type *)malloc(0x30);
  if (product_type == (coda_product_type *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x30,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                   ,0x1e2);
  }
  else {
    product_type->num_product_definitions = 0;
    product_type->description = (char *)0x0;
    product_type->product_definition = (coda_product_definition **)0x0;
    product_type->hash_data = (hashtable *)0x0;
    pcVar1 = strdup(name);
    product_type->name = pcVar1;
    if (pcVar1 == (char *)0x0) {
      pcVar1 = "out of memory (could not duplicate string) (%s:%u)";
      uVar3 = 0x1ef;
    }
    else {
      phVar2 = coda_hashtable_new(1);
      product_type->hash_data = phVar2;
      if (phVar2 != (hashtable *)0x0) {
        return product_type;
      }
      pcVar1 = "out of memory (could not create hashtable) (%s:%u)";
      uVar3 = 0x1f8;
    }
    coda_set_error(-1,pcVar1,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                   ,uVar3);
    coda_product_type_delete(product_type);
  }
  return (coda_product_type *)0x0;
}

Assistant:

coda_product_type *coda_product_type_new(const char *name)
{
    coda_product_type *product_type;

    product_type = malloc(sizeof(coda_product_type));
    if (product_type == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_product_type), __FILE__, __LINE__);
        return NULL;
    }
    product_type->name = NULL;
    product_type->description = NULL;
    product_type->num_product_definitions = 0;
    product_type->hash_data = NULL;
    product_type->product_definition = NULL;

    product_type->name = strdup(name);
    if (product_type->name == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                       __LINE__);
        coda_product_type_delete(product_type);
        return NULL;
    }

    product_type->hash_data = hashtable_new(1);
    if (product_type->hash_data == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not create hashtable) (%s:%u)", __FILE__,
                       __LINE__);
        coda_product_type_delete(product_type);
        return NULL;
    }

    return product_type;
}